

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

bool __thiscall
slang::ast::ConditionalExpression::propagateType
          (ConditionalExpression *this,ASTContext *context,Type *newType,SourceRange opRange,
          ConversionKind conversionKind)

{
  bitmask<slang::ast::ASTFlags> in_RCX;
  Expression **in_RDX;
  anon_class_48_6_9004a454 *in_RSI;
  _Optional_payload_base<unsigned_int> in_RDI;
  optional<unsigned_int> rightEffectiveWidth;
  optional<unsigned_int> leftEffectiveWidth;
  anon_class_48_6_9004a454 handleBranch;
  bitmask<slang::ast::ASTFlags> rightFlags;
  bitmask<slang::ast::ASTFlags> leftFlags;
  bool parentTypeEquiv;
  Type *in_stack_ffffffffffffff90;
  Type *in_stack_ffffffffffffff98;
  bitmask<slang::ast::ASTFlags> local_60;
  bitmask<slang::ast::ASTFlags> local_58;
  bitmask<slang::ast::ASTFlags> local_50;
  bitmask<slang::ast::ASTFlags> local_48;
  Type *local_40;
  not_null<const_slang::ast::Type_*> local_38;
  undefined1 local_2d;
  _Optional_payload_base<unsigned_int> otherEffectiveWidth;
  
  otherEffectiveWidth = in_RDI;
  not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xf44f0c);
  local_2d = Type::isEquivalent(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>(&local_38,&local_40);
  ((not_null<const_slang::ast::Type_*> *)((long)in_RDI + 8))->ptr = local_38.ptr;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_48,None);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_50,None);
  if ((*(bool *)((long)in_RDI + 0x58) & 1U) != 0) {
    if ((*(bool *)((long)in_RDI + 0x59) & 1U) == 0) {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_60,UnevaluatedBranch);
      local_48.m_bits = local_60.m_bits;
    }
    else {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_58,UnevaluatedBranch);
      local_50.m_bits = local_58.m_bits;
    }
  }
  left((ConditionalExpression *)in_RDI);
  Expression::getEffectiveWidth((Expression *)in_RDI);
  right((ConditionalExpression *)in_RDI);
  Expression::getEffectiveWidth((Expression *)in_RDI);
  propagateType::anon_class_48_6_9004a454::operator()
            (in_RSI,in_RDX,in_RCX,(optional<unsigned_int>)otherEffectiveWidth);
  propagateType::anon_class_48_6_9004a454::operator()
            (in_RSI,in_RDX,in_RCX,(optional<unsigned_int>)otherEffectiveWidth);
  return true;
}

Assistant:

bool ConditionalExpression::propagateType(const ASTContext& context, const Type& newType,
                                          SourceRange opRange, ConversionKind conversionKind) {
    const bool parentTypeEquiv = type->isEquivalent(newType);
    type = &newType;

    bitmask<ASTFlags> leftFlags = ASTFlags::None;
    bitmask<ASTFlags> rightFlags = ASTFlags::None;
    if (isConst) {
        if (isTrue)
            rightFlags = ASTFlags::UnevaluatedBranch;
        else
            leftFlags = ASTFlags::UnevaluatedBranch;
    }

    auto handleBranch = [&](Expression*& expr, bitmask<ASTFlags> flags,
                            std::optional<bitwidth_t> otherEffectiveWidth) {
        // This is a propagated conversion but we'd like to see width-expand
        // warnings anyway so we'll manually do the check conversion check here.
        if (!flags.has(ASTFlags::UnevaluatedBranch) &&
            conversionKind <= ConversionKind::Propagated) {
            // If the parent type was already equivalent to what's being propagated,
            // then the only conversions we might be doing are "self induced", in the
            // sense that one branch is propagating its type to the other side.
            // We want to avoid warning in those cases where we have a literal
            // expression with a smaller effective type, like for example:
            //   bit a, b, c;
            //   c = a ? b : 0; // 32-bit literal 0 shouldn't cause a warning
            if (!parentTypeEquiv || !newType.isNumeric() || !expr->type->isNumeric() ||
                !otherEffectiveWidth || expr->type->getBitWidth() < otherEffectiveWidth) {
                ConversionExpression::checkImplicitConversions(context, *expr->type, newType, *expr,
                                                               this, opRange,
                                                               ConversionKind::Implicit);
            }
        }

        contextDetermined(context.resetFlags(flags), expr, this, newType, opRange);
    };

    auto leftEffectiveWidth = left().getEffectiveWidth();
    auto rightEffectiveWidth = right().getEffectiveWidth();
    handleBranch(left_, leftFlags, rightEffectiveWidth);
    handleBranch(right_, rightFlags, leftEffectiveWidth);

    // The predicate is self determined so no need to handle it here.
    return true;
}